

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

void __thiscall si9ma::SinglyLinkedList::print_list(SinglyLinkedList *this,string *separator)

{
  ostream *poVar1;
  SinglyNodeWithRand *local_20;
  SinglyNodeWithRand *ptr;
  string *separator_local;
  SinglyLinkedList *this_local;
  
  for (local_20 = this->head; local_20 != (SinglyNodeWithRand *)0x0; local_20 = local_20->next) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_20->value);
    std::operator<<(poVar1,(string *)separator);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SinglyLinkedList::print_list(string separator) {
        SinglyNodeWithRand *ptr = head;
        while (ptr != nullptr){
            std::cout << ptr->value << separator;
            ptr = ptr->next;
        }

        std::cout << std::endl;
    }